

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void hashTableDestroy(HASH_TABLE *table)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = table->size;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (table->v[uVar2] != (NAMED *)0x0) {
        (*table->mem->free_fcn)(table->v[uVar2]);
        uVar1 = table->size;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  if (table->v != (NAMED **)0x0) {
    (*table->mem->free_fcn)(table->v);
    return;
  }
  return;
}

Assistant:

static
void hashTableDestroy(HASH_TABLE *table)
{
  size_t i;
  for (i = 0; i < table->size; i++) {
    NAMED *p = table->v[i];
    if (p)
      table->mem->free_fcn(p);
  }
  if (table->v)
    table->mem->free_fcn(table->v);
}